

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O1

int Abc_NtkDontCareSimulate(Odc_Man_t *p,uint *puTruth)

{
  ushort uVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  
  p->nTravIds = p->nTravIds + 1;
  Abc_NtkDontCareSimulate_rec(p,p->iRoot & 0xfffe);
  uVar1 = p->iRoot;
  uVar5 = (uint)(uVar1 >> 1);
  if (p->vTruths->nSize <= (int)uVar5) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  if (0 < (long)p->nWords) {
    pvVar2 = p->vTruths->pArray[uVar5];
    lVar4 = (long)p->nWords + 1;
    do {
      puTruth[lVar4 + -2] = *(uint *)((long)pvVar2 + lVar4 * 4 + -8);
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  if (((uVar1 & 1) != 0) && (0 < (long)p->nWords)) {
    lVar4 = (long)p->nWords + 1;
    do {
      puTruth[lVar4 + -2] = ~puTruth[lVar4 + -2];
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  uVar5 = 1 << ((char)p->nVarsMax - 5U & 0x1f);
  if (p->nVarsMax < 6) {
    uVar5 = 1;
  }
  if ((int)uVar5 < 1) {
    iVar3 = 0;
  }
  else {
    lVar4 = (ulong)uVar5 + 1;
    iVar3 = 0;
    do {
      uVar5 = (puTruth[lVar4 + -2] >> 1 & 0x55555555) + (puTruth[lVar4 + -2] & 0x55555555);
      uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333);
      uVar5 = (uVar5 >> 4 & 0x7070707) + (uVar5 & 0x7070707);
      uVar5 = (uVar5 >> 8 & 0xf000f) + (uVar5 & 0xf000f);
      iVar3 = (uVar5 >> 0x10) + iVar3 + (uVar5 & 0xffff);
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  return iVar3;
}

Assistant:

int Abc_NtkDontCareSimulate( Odc_Man_t * p, unsigned * puTruth )
{
    Odc_ManIncrementTravId( p );
    Abc_NtkDontCareSimulate_rec( p, Odc_Regular(p->iRoot) );
    Abc_InfoCopy( puTruth, Odc_ObjTruth(p, Odc_Regular(p->iRoot)), p->nWords );
    if ( Odc_IsComplement(p->iRoot) )
        Abc_InfoNot( puTruth, p->nWords );
    return Extra_TruthCountOnes( puTruth, p->nVarsMax );
}